

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void process_playing(DUMB_IT_SIGRENDERER *sigrenderer,IT_PLAYING *playing,float invt2g)

{
  IT_PLAYING *in_RSI;
  IT_PLAYING *in_RDI;
  DUMB_IT_SIGRENDERER *unaff_retaddr;
  DUMB_IT_SIGDATA *sigdata;
  DUMB_IT_SIGDATA *sigdata_00;
  
  sigdata_00 = *(DUMB_IT_SIGDATA **)in_RDI;
  if (in_RSI->instrument != (IT_INSTRUMENT *)0x0) {
    if ((sigdata_00->flags & 0x40U) == 0) {
      update_it_envelopes((IT_PLAYING *)sigdata_00);
    }
    else {
      update_xm_envelopes((IT_PLAYING *)0x9bd377);
    }
    update_fadeout(sigdata_00,in_RSI);
  }
  playing_volume_setup(unaff_retaddr,in_RDI,(float)((ulong)in_RSI >> 0x20));
  if ((sigdata_00->flags & 0x40U) == 0) {
    in_RSI->sample_vibrato_depth = (uint)in_RSI->sample->vibrato_rate + in_RSI->sample_vibrato_depth
    ;
    if ((int)((uint)in_RSI->sample->vibrato_depth * 0x100) < in_RSI->sample_vibrato_depth) {
      in_RSI->sample_vibrato_depth = (uint)in_RSI->sample->vibrato_depth << 8;
    }
  }
  else if (in_RSI->sample_vibrato_depth < (int)(uint)in_RSI->sample->vibrato_rate) {
    in_RSI->sample_vibrato_depth = in_RSI->sample_vibrato_depth + 1;
  }
  in_RSI->sample_vibrato_time = in_RSI->sample_vibrato_time + in_RSI->sample->vibrato_speed;
  return;
}

Assistant:

static void process_playing(DUMB_IT_SIGRENDERER *sigrenderer, IT_PLAYING *playing, float invt2g)
{
	DUMB_IT_SIGDATA * sigdata = sigrenderer->sigdata;

	if (playing->instrument) {
		if (sigdata->flags & IT_WAS_AN_XM)
			update_xm_envelopes(playing);
		else
			update_it_envelopes(playing);
		update_fadeout(sigdata, playing);
	}

	playing_volume_setup(sigrenderer, playing, invt2g);

	if (sigdata->flags & IT_WAS_AN_XM) {
		/* 'depth' is used to store the tick number for XM files. */
		if (playing->sample_vibrato_depth < playing->sample->vibrato_rate)
			playing->sample_vibrato_depth++;
	} else {
		playing->sample_vibrato_depth += playing->sample->vibrato_rate;
		if (playing->sample_vibrato_depth > playing->sample->vibrato_depth << 8)
			playing->sample_vibrato_depth = playing->sample->vibrato_depth << 8;
	}

	playing->sample_vibrato_time += playing->sample->vibrato_speed;
}